

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

_Bool ts_node_has_error(TSNode self)

{
  uint32_t uVar1;
  
  uVar1 = ts_subtree_error_cost(*(Subtree *)self.context._8_8_);
  return uVar1 != 0;
}

Assistant:

bool ts_node_has_error(TSNode self) {
  return ts_subtree_error_cost(ts_node__subtree(self)) > 0;
}